

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
EditingIterator::MoveCurrentTo
          (EditingIterator *this,
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
          *toList)

{
  RealCount *pRVar1;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar2;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar3;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar4;
  
  pDVar2 = (this->super_Iterator).current;
  pDVar3 = (pDVar2->next).base;
  pDVar4 = (pDVar2->prev).base;
  (pDVar4->next).base = pDVar3;
  pDVar3->prev = pDVar2->prev;
  pDVar3 = (toList->
           super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
           next.base;
  pDVar2->prev = pDVar3->prev;
  (pDVar2->next).base = pDVar3;
  (((pDVar3->prev).base)->next).base = pDVar2;
  (pDVar3->prev).base = pDVar2;
  (this->super_Iterator).current = pDVar4;
  pRVar1 = &((this->super_Iterator).list)->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  (toList->super_RealCount).count = (toList->super_RealCount).count + 1;
  return;
}

Assistant:

void MoveCurrentTo(DListBase * toList)
        {
            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            DListBase::InsertNodeBefore(toList->Next(), node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
            toList->IncrementCount();
        }